

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint64 HashLen16(uint64 u,uint64 v,uint64 mul)

{
  ulong uVar1;
  uint64 b;
  uint64 a;
  uint64 mul_local;
  uint64 v_local;
  uint64 u_local;
  
  uVar1 = (u ^ v) * mul;
  uVar1 = (v ^ uVar1 >> 0x2f ^ uVar1) * mul;
  return mul * (uVar1 >> 0x2f ^ uVar1);
}

Assistant:

static uint64 HashLen16(uint64 u, uint64 v, uint64 mul) {
  // Murmur-inspired hashing.
  uint64 a = (u ^ v) * mul;
  a ^= (a >> 47);
  uint64 b = (v ^ a) * mul;
  b ^= (b >> 47);
  b *= mul;
  return b;
}